

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseParser.cpp
# Opt level: O1

void __thiscall phpconvert::BaseParser::~BaseParser(BaseParser *this)

{
  pointer pcVar1;
  
  this->_vptr_BaseParser = (_func_int **)&PTR__BaseParser_00146c20;
  pcVar1 = (this->outputDir)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->outputDir).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->sourceDir)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->sourceDir).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

BaseParser::~BaseParser() {
    }